

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O3

void __thiscall
Lib::
Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
::~Stack(Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
         *this)

{
  FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *pFVar1;
  ulong uVar2;
  FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *pFVar3;
  
  for (pFVar3 = this->_cursor; pFVar1 = this->_stack, pFVar3 != pFVar1; pFVar3 = pFVar3 + -1) {
    mpz_clear(pFVar3[-1].numeral._den._val);
    mpz_clear((__mpz_struct *)&pFVar3[-1].numeral);
  }
  if (pFVar3 != (FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0) {
    uVar2 = this->_capacity << 6;
    if (uVar2 == 0) {
      *(undefined8 *)pFVar1 = GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pFVar1;
    }
    else {
      if (0x40 < uVar2) {
        operator_delete(pFVar1,0x10);
        return;
      }
      *(undefined8 *)pFVar1 = GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = pFVar1;
    }
  }
  return;
}

Assistant:

inline ~Stack()
  {
    //The while cycle is completely eliminated by compiler
    //in "-O6 -DVDEBUG=0" mode for types without destructor,
    //so this destructor is constant time.
    C* p=_cursor;
    while(p!=_stack) {
      (--p)->~C();
    }
    if(_stack) {
      DEALLOC_KNOWN(_stack,_capacity*sizeof(C),className());
    }
    else {
      ASS_EQ(_capacity,0);
    }
  }